

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CLayerGroup::Mapping(CLayerGroup *this,float *pPoints)

{
  CRenderTools *aPoints;
  CRenderTools *in_RSI;
  undefined8 *in_RDI;
  float Aspect;
  float OffsetY;
  float OffsetX;
  float ParallaxY;
  float Zoom;
  float ParallaxX;
  
  aPoints = CEditor::RenderTools(*(CEditor **)*in_RDI);
  ParallaxX = *(float *)(*(long *)*in_RDI + 0x1084);
  Zoom = *(float *)(*(long *)*in_RDI + 0x1088);
  Aspect = (float)*(int *)(in_RDI + 4) / 100.0;
  OffsetY = (float)*(int *)((long)in_RDI + 0x24) / 100.0;
  OffsetX = (float)*(int *)(in_RDI + 3);
  ParallaxY = (float)*(int *)((long)in_RDI + 0x1c);
  CEditor::Graphics(*(CEditor **)*in_RDI);
  IGraphics::ScreenAspect((IGraphics *)CONCAT44(Aspect,Zoom));
  CRenderTools::MapScreenToWorld
            (in_RSI,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),ParallaxX,ParallaxY,OffsetX,
             OffsetY,Aspect,Zoom,(float *)aPoints);
  *(float *)&in_RSI->m_pConfig =
       *(float *)(*(long *)*in_RDI + 0x108c) + *(float *)&in_RSI->m_pConfig;
  *(float *)((long)&in_RSI->m_pConfig + 4) =
       *(float *)(*(long *)*in_RDI + 0x1090) + *(float *)((long)&in_RSI->m_pConfig + 4);
  *(float *)&in_RSI->m_pGraphics =
       *(float *)(*(long *)*in_RDI + 0x108c) + *(float *)&in_RSI->m_pGraphics;
  *(float *)((long)&in_RSI->m_pGraphics + 4) =
       *(float *)(*(long *)*in_RDI + 0x1090) + *(float *)((long)&in_RSI->m_pGraphics + 4);
  return;
}

Assistant:

void CLayerGroup::Mapping(float *pPoints)
{
	m_pMap->m_pEditor->RenderTools()->MapScreenToWorld(
		m_pMap->m_pEditor->m_WorldOffsetX, m_pMap->m_pEditor->m_WorldOffsetY,
		m_ParallaxX/100.0f, m_ParallaxY/100.0f,
		m_OffsetX, m_OffsetY,
		m_pMap->m_pEditor->Graphics()->ScreenAspect(), m_pMap->m_pEditor->m_WorldZoom, pPoints);

	pPoints[0] += m_pMap->m_pEditor->m_EditorOffsetX;
	pPoints[1] += m_pMap->m_pEditor->m_EditorOffsetY;
	pPoints[2] += m_pMap->m_pEditor->m_EditorOffsetX;
	pPoints[3] += m_pMap->m_pEditor->m_EditorOffsetY;
}